

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

char * luaL_findtable(lua_State *L,int idx,char *fname,int szhint)

{
  int iVar1;
  lua_State *L_00;
  size_t sVar2;
  int in_ECX;
  lua_State *in_RDX;
  lua_State *in_RDI;
  char *e;
  int in_stack_ffffffffffffffbc;
  lua_State *in_stack_ffffffffffffffc0;
  lua_State *in_stack_ffffffffffffffc8;
  lua_State *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  lua_State *local_20;
  
  lua_pushvalue(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  local_20 = in_RDX;
  do {
    L_00 = (lua_State *)strchr((char *)local_20,0x2e);
    if (L_00 == (lua_State *)0x0) {
      in_stack_ffffffffffffffc8 = local_20;
      sVar2 = strlen((char *)local_20);
      L_00 = (lua_State *)((long)&(in_stack_ffffffffffffffc8->nextgc).gcptr32 + sVar2);
    }
    lua_pushlstring((lua_State *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),(char *)L_00,
                    (size_t)in_stack_ffffffffffffffc8);
    lua_rawget(L_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    iVar1 = lua_type(in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    if (iVar1 == 0) {
      lua_settop(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      in_stack_ffffffffffffffbc = in_ECX;
      if ((char)(L_00->nextgc).gcptr32 == '.') {
        in_stack_ffffffffffffffbc = 1;
      }
      in_stack_ffffffffffffffc0 = in_RDI;
      lua_createtable((lua_State *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                      (int)((ulong)L_00 >> 0x20),(int)L_00);
      lua_pushlstring((lua_State *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),(char *)L_00,
                      (size_t)in_stack_ffffffffffffffc8);
      lua_pushvalue(L_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      lua_settable((lua_State *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                   (int)((ulong)L_00 >> 0x20));
    }
    else {
      iVar1 = lua_type(in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
      if (iVar1 != 5) {
        lua_settop(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        return (char *)local_20;
      }
    }
    lua_remove(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    local_20 = (lua_State *)((long)&(L_00->nextgc).gcptr32 + 1);
  } while ((char)(L_00->nextgc).gcptr32 == '.');
  return (char *)0x0;
}

Assistant:

LUALIB_API const char *luaL_findtable(lua_State *L, int idx,
				      const char *fname, int szhint)
{
  const char *e;
  lua_pushvalue(L, idx);
  do {
    e = strchr(fname, '.');
    if (e == NULL) e = fname + strlen(fname);
    lua_pushlstring(L, fname, (size_t)(e - fname));
    lua_rawget(L, -2);
    if (lua_isnil(L, -1)) {  /* no such field? */
      lua_pop(L, 1);  /* remove this nil */
      lua_createtable(L, 0, (*e == '.' ? 1 : szhint)); /* new table for field */
      lua_pushlstring(L, fname, (size_t)(e - fname));
      lua_pushvalue(L, -2);
      lua_settable(L, -4);  /* set new table into field */
    } else if (!lua_istable(L, -1)) {  /* field has a non-table value? */
      lua_pop(L, 2);  /* remove table and value */
      return fname;  /* return problematic part of the name */
    }
    lua_remove(L, -2);  /* remove previous table */
    fname = e + 1;
  } while (*e == '.');
  return NULL;
}